

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall
PeleLM::compute_enthalpy_fluxes(PeleLM *this,MultiFab **flux,MultiFab **beta,Real time)

{
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  bool bVar5;
  int iVar6;
  FabType FVar7;
  FabFactory<amrex::FArrayBox> *pFVar8;
  StateDescriptor *this_00;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *pVVar9;
  BoxArray *pBVar10;
  long lVar11;
  MLEBABecLap *this_01;
  long in_RDI;
  Real run_time;
  int IOProc;
  Array4<double> *enth_d;
  Array4<double> *flux_enthaply_d_1;
  Array4<double> *flux_species_d;
  Box *ebox_d_1;
  int dir_1;
  Array4<double> *flux_enthaply_d;
  Box *ebox_d;
  int dir;
  Box result;
  EBCellFlagFab *flags;
  EBFArrayBox *in_fab;
  Box *bx;
  MFIter mfi_1;
  BoxArray *ba;
  int idim;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> math_bc;
  Array4<double> *Hi;
  Array4<const_double> *T;
  Box *gbx;
  MFIter mfi;
  MultiFab Enth;
  Real b;
  Real a;
  MultiFab TT;
  int ngrow;
  PeleLM *clev;
  MultiFab TTc;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  BCRec *bc;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *theBCs;
  MLMG mg;
  MLEBABecLap op;
  EBFArrayBoxFactory **ebf;
  LPInfo info;
  Real strt_time;
  BoxArray *in_stack_ffffffffffffe538;
  MLLinOp *a_lp;
  MFIter *mfi_00;
  PeleLM *in_stack_ffffffffffffe540;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffe548;
  FabArray<amrex::FArrayBox> *this_02;
  MLEBABecLap *in_stack_ffffffffffffe550;
  int in_stack_ffffffffffffe55c;
  int in_stack_ffffffffffffe560;
  int in_stack_ffffffffffffe564;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffe568;
  long *plVar12;
  Print *in_stack_ffffffffffffe570;
  long *plVar13;
  BoxArray *in_stack_ffffffffffffe578;
  LPInfo *in_stack_ffffffffffffe580;
  anon_class_192_3_e870adef *in_stack_ffffffffffffe588;
  Box *in_stack_ffffffffffffe590;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffe598;
  MLEBABecLap *in_stack_ffffffffffffe5a0;
  undefined1 *in_stack_ffffffffffffe5a8;
  Print *in_stack_ffffffffffffe5b0;
  Array<BCType,_3> *in_stack_ffffffffffffe5b8;
  MLLinOp *in_stack_ffffffffffffe5c0;
  int *piVar14;
  undefined8 in_stack_ffffffffffffe5c8;
  NavierStokesBase *in_stack_ffffffffffffe5d0;
  long *local_19f0;
  Box *bx_in;
  EBCellFlagFab *in_stack_ffffffffffffe668;
  undefined1 ***local_1918;
  undefined1 ***local_1900;
  int in_stack_ffffffffffffe76c;
  int in_stack_ffffffffffffe770;
  int in_stack_ffffffffffffe774;
  Real in_stack_ffffffffffffe778;
  int in_stack_ffffffffffffe784;
  MultiFab *in_stack_ffffffffffffe788;
  AmrLevel *in_stack_ffffffffffffe790;
  int in_stack_ffffffffffffe7a0;
  double local_1728;
  int local_171c;
  undefined1 local_1718 [64];
  undefined1 auStack_16d8 [64];
  undefined1 auStack_1698 [64];
  undefined1 local_1658 [64];
  undefined1 *local_1618;
  undefined1 local_1610 [32];
  int in_stack_ffffffffffffea10;
  int in_stack_ffffffffffffea14;
  MultiFab **in_stack_ffffffffffffea18;
  MLEBABecLap *in_stack_ffffffffffffea20;
  undefined1 local_15c8 [64];
  undefined1 *local_1588;
  undefined1 local_157c [28];
  undefined1 *local_1560;
  int local_1554;
  undefined1 local_1550 [64];
  undefined1 local_1510 [64];
  undefined1 *local_14d0;
  undefined1 local_14c4 [36];
  int local_14a0;
  Box local_149c;
  EBCellFlagFab *local_1480;
  EBFArrayBox *local_1478;
  int local_146c [7];
  int *local_1450;
  MFIter local_1448;
  undefined8 local_13e8;
  undefined8 uStack_13e0;
  undefined8 local_13d8;
  undefined8 uStack_13d0;
  undefined8 local_13c8;
  BoxArray *local_13b8;
  int local_13ac;
  long local_13a8 [29];
  MultiFab *in_stack_ffffffffffffed40;
  MultiFab *in_stack_ffffffffffffed48;
  MultiFab *in_stack_ffffffffffffed50;
  MultiFab *in_stack_ffffffffffffed58;
  int in_stack_ffffffffffffed64;
  MLCellLinOp *in_stack_ffffffffffffed68;
  int in_stack_ffffffffffffee98;
  int in_stack_ffffffffffffee9c;
  MultiFab *in_stack_ffffffffffffeea0;
  MultiFab *in_stack_ffffffffffffeea8;
  MultiFab *in_stack_ffffffffffffeeb0;
  MultiFab *in_stack_ffffffffffffeeb8;
  long local_f28 [7];
  undefined1 local_ef0 [64];
  undefined1 auStack_eb0 [64];
  undefined1 local_e70 [56];
  Real in_stack_fffffffffffff1c8;
  MultiFab *in_stack_fffffffffffff1d0;
  undefined1 *__src;
  int in_stack_fffffffffffff1d8;
  int in_stack_fffffffffffff1dc;
  MultiFab **in_stack_fffffffffffff1e0;
  MultiFab *in_stack_fffffffffffff1e8;
  MLMG *in_stack_fffffffffffff1f0;
  undefined1 local_ddc [28];
  undefined1 *local_dc0;
  MFIter local_db8;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 local_ba8;
  undefined8 local_ba0;
  undefined1 local_b98 [32];
  undefined8 local_b78;
  undefined4 local_9ec;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  PeleLM *local_9b8;
  MultiFab local_9b0;
  BCRec *local_818;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_810;
  long local_668;
  long *local_660;
  undefined8 local_658;
  undefined1 **local_630 [2];
  undefined8 **local_620;
  undefined8 local_618;
  undefined8 **local_5f0;
  undefined1 **local_5e8 [13];
  undefined8 **local_580;
  undefined8 local_578;
  undefined1 local_540 [200];
  undefined1 *local_478;
  undefined8 local_470;
  int in_stack_fffffffffffffd10;
  Geometry *in_stack_fffffffffffffd18;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffd20;
  long local_78;
  long *local_70;
  LPInfo local_68;
  double local_48;
  undefined4 local_1c;
  int *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_48 = amrex::ParallelDescriptor::second();
  amrex::LPInfo::LPInfo(&local_68);
  amrex::LPInfo::setAgglomeration(&local_68,true);
  amrex::LPInfo::setConsolidation(&local_68,true);
  amrex::LPInfo::setMetricTerm(&local_68,false);
  amrex::LPInfo::setMaxCoarseningLevel(&local_68,0);
  amrex::Amr::getLevel
            ((Amr *)in_stack_ffffffffffffe540,(int)((ulong)in_stack_ffffffffffffe538 >> 0x20));
  pFVar8 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe540);
  local_78 = __dynamic_cast(pFVar8,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (local_78 != 0) {
    local_70 = &local_78;
    memcpy(local_540,(void *)(in_RDI + 0x10),200);
    local_470 = 1;
    local_478 = local_540;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x2a7b98);
    iVar1._M_len = (size_type)in_stack_ffffffffffffe550;
    iVar1._M_array = (iterator)in_stack_ffffffffffffe548;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffe540,iVar1,(allocator_type *)in_stack_ffffffffffffe538);
    local_5f0 = local_5e8;
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffe540,in_stack_ffffffffffffe538);
    local_580 = local_5e8;
    local_578 = 1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x2a7c16);
    iVar2._M_len = (size_type)in_stack_ffffffffffffe550;
    iVar2._M_array = (iterator)in_stack_ffffffffffffe548;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffe540,iVar2,(allocator_type *)in_stack_ffffffffffffe538);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_ffffffffffffe540,
               (DistributionMapping *)in_stack_ffffffffffffe538);
    local_618 = 1;
    local_620 = local_630;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x2a7c92);
    iVar3._M_len = (size_type)in_stack_ffffffffffffe550;
    iVar3._M_array = (iterator)in_stack_ffffffffffffe548;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffe540,iVar3,(allocator_type *)in_stack_ffffffffffffe538);
    local_668 = *local_70;
    local_660 = &local_668;
    local_658 = 1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x2a7cfd);
    iVar4._M_len = (size_type)in_stack_ffffffffffffe550;
    iVar4._M_array = (iterator)in_stack_ffffffffffffe548;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)in_stack_ffffffffffffe540,iVar4,(allocator_type *)in_stack_ffffffffffffe538);
    a_lp = (MLLinOp *)CONCAT44((int)((ulong)in_stack_ffffffffffffe538 >> 0x20),1);
    amrex::MLEBABecLap::MLEBABecLap
              (in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffe590,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffe588,in_stack_ffffffffffffe580,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffe578,(int)in_stack_ffffffffffffe5b0);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x2a7d71);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x2a7d7e);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x2a7d8b);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x2a7d98);
    local_1900 = (undefined1 ***)&local_620;
    do {
      local_1900 = local_1900 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x2a7dcd);
    } while (local_1900 != local_630);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x2a7df7);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x2a7e04);
    local_1918 = (undefined1 ***)&local_580;
    do {
      local_1918 = local_1918 + -0xd;
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffe540);
    } while (local_1918 != local_5e8);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x2a7e63);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x2a7e70);
    iVar6 = Diffusion::maxOrder(*(Diffusion **)(in_RDI + 0xbf8));
    amrex::MLLinOp::setMaxOrder((MLLinOp *)&stack0xfffffffffffffbb0,iVar6);
    amrex::MLMG::MLMG((MLMG *)in_stack_ffffffffffffe540,a_lp);
    this_00 = amrex::DescriptorList::operator[]
                        ((DescriptorList *)in_stack_ffffffffffffe540,(int)((ulong)a_lp >> 0x20));
    local_810 = amrex::StateDescriptor::getBCs(this_00);
    local_818 = amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                          ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                           in_stack_ffffffffffffe540,(size_type)a_lp);
    iVar6 = (int)((ulong)a_lp >> 0x20);
    Diffusion::setDomainBC
              ((array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe550,
               (array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffe548,
               (BCRec *)in_stack_ffffffffffffe540);
    amrex::MLLinOp::setDomainBC
              (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,
               (Array<BCType,_3> *)in_stack_ffffffffffffe5b0);
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe540);
    if (0 < *(int *)(in_RDI + 8)) {
      local_9b8 = getLevel(in_stack_ffffffffffffe540,iVar6);
      local_9d8 = 0;
      uStack_9d0 = 0;
      local_9e8 = 0;
      uStack_9e0 = 0;
      local_9c8 = 0;
      amrex::MFInfo::MFInfo((MFInfo *)0x2a7fe0);
      amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe540);
      amrex::MultiFab::define
                ((MultiFab *)in_stack_ffffffffffffe590,(BoxArray *)in_stack_ffffffffffffe588,
                 (DistributionMapping *)in_stack_ffffffffffffe580,
                 (int)((ulong)in_stack_ffffffffffffe578 >> 0x20),(int)in_stack_ffffffffffffe578,
                 (MFInfo *)in_stack_ffffffffffffe570,
                 (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe5a0);
      amrex::MFInfo::~MFInfo((MFInfo *)0x2a8032);
      amrex::AmrLevel::FillPatch
                (in_stack_ffffffffffffe790,in_stack_ffffffffffffe788,in_stack_ffffffffffffe784,
                 in_stack_ffffffffffffe778,in_stack_ffffffffffffe774,in_stack_ffffffffffffe770,
                 in_stack_ffffffffffffe76c,in_stack_ffffffffffffe7a0);
      local_8 = (int *)(in_RDI + 0x158);
      local_c = 0;
      amrex::MLLinOp::setCoarseFineBC((MLLinOp *)&stack0xfffffffffffffbb0,&local_9b0,*local_8);
    }
    local_9ec = 1;
    local_b98._16_4_ = 0;
    local_b98._20_4_ = 0;
    local_b98._24_8_ = 0;
    local_b98._0_4_ = 0;
    local_b98._4_4_ = 0;
    local_b98._8_4_ = 0;
    local_b98._12_4_ = 0;
    local_b78 = 0;
    bx_in = (Box *)local_b98;
    amrex::MFInfo::MFInfo((MFInfo *)0x2a8394);
    amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe540);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578,
               (DistributionMapping *)in_stack_ffffffffffffe570,
               (int)((ulong)in_stack_ffffffffffffe568 >> 0x20),(int)in_stack_ffffffffffffe568,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe590);
    amrex::MFInfo::~MFInfo((MFInfo *)0x2a83eb);
    amrex::AmrLevel::FillPatch
              (in_stack_ffffffffffffe790,in_stack_ffffffffffffe788,in_stack_ffffffffffffe784,
               in_stack_ffffffffffffe778,in_stack_ffffffffffffe774,in_stack_ffffffffffffe770,
               in_stack_ffffffffffffe76c,in_stack_ffffffffffffe7a0);
    amrex::MLCellLinOp::setLevelBC
              (in_stack_ffffffffffffed68,in_stack_ffffffffffffed64,in_stack_ffffffffffffed58,
               in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    local_ba0 = 0;
    local_ba8 = 0x3ff0000000000000;
    amrex::MLEBABecLap::setScalars
              (in_stack_ffffffffffffe550,(Real)in_stack_ffffffffffffe548,
               (Real)in_stack_ffffffffffffe540);
    Diffusion::setBeta(in_stack_ffffffffffffea20,in_stack_ffffffffffffea18,in_stack_ffffffffffffea14
                       ,in_stack_ffffffffffffea10);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe570,
               (value_type)in_stack_ffffffffffffe568,in_stack_ffffffffffffe564,
               in_stack_ffffffffffffe560,in_stack_ffffffffffffe55c);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe570,
               (value_type)in_stack_ffffffffffffe568,in_stack_ffffffffffffe564,
               in_stack_ffffffffffffe560,in_stack_ffffffffffffe55c);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe570,
               (value_type)in_stack_ffffffffffffe568,in_stack_ffffffffffffe564,
               in_stack_ffffffffffffe560,in_stack_ffffffffffffe55c);
    Diffusion::computeExtensiveFluxes
              (in_stack_fffffffffffff1f0,in_stack_fffffffffffff1e8,in_stack_fffffffffffff1e0,
               in_stack_fffffffffffff1dc,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0,
               in_stack_fffffffffffff1c8);
    local_d48 = 0;
    uStack_d40 = 0;
    local_d58 = 0;
    uStack_d50 = 0;
    local_d38 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x2a85c0);
    pVVar9 = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
             amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe540);
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffe580,in_stack_ffffffffffffe578,
               (DistributionMapping *)in_stack_ffffffffffffe570,
               (int)((ulong)in_stack_ffffffffffffe568 >> 0x20),(int)in_stack_ffffffffffffe568,
               (MFInfo *)CONCAT44(in_stack_ffffffffffffe564,in_stack_ffffffffffffe560),
               (FabFactory<amrex::FArrayBox> *)in_stack_ffffffffffffe590);
    amrex::MFInfo::~MFInfo((MFInfo *)0x2a8617);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,
               SUB41((uint)in_stack_ffffffffffffe564 >> 0x18,0));
    while( true ) {
      bVar5 = amrex::MFIter::isValid(&local_db8);
      iVar6 = (int)((ulong)in_stack_ffffffffffffe5c0 >> 0x20);
      if (!bVar5) break;
      amrex::MFIter::growntilebox
                ((MFIter *)in_stack_ffffffffffffe5b0,(int)((ulong)in_stack_ffffffffffffe5a8 >> 0x20)
                );
      local_dc0 = local_ddc;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffe548,(MFIter *)in_stack_ffffffffffffe540);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe550,
                 (MFIter *)in_stack_ffffffffffffe548,(int)((ulong)in_stack_ffffffffffffe540 >> 0x20)
                );
      __src = auStack_eb0 + 0x40;
      memcpy(local_ef0,&stack0xfffffffffffff1d8,0x3c);
      memcpy(auStack_eb0,__src,0x3c);
      amrex::
      ParallelFor<PeleLM::compute_enthalpy_fluxes(amrex::MultiFab*const*,amrex::MultiFab_const*const*,double)::__0>
                (in_stack_ffffffffffffe590,(anon_class_128_2_7fd72650 *)in_stack_ffffffffffffe588);
      amrex::MFIter::operator++(&local_db8);
    }
    amrex::MFIter::~MFIter((MFIter *)in_stack_ffffffffffffe540);
    std::allocator<amrex::BCRec>::allocator((allocator<amrex::BCRec> *)0x2a87e7);
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffe540,
               (size_type)pVVar9,(allocator_type *)0x2a8801);
    std::allocator<amrex::BCRec>::~allocator((allocator<amrex::BCRec> *)0x2a8810);
    NavierStokesBase::fetchBCArray
              (in_stack_ffffffffffffe5d0,(int)((ulong)in_stack_ffffffffffffe5c8 >> 0x20),
               (int)in_stack_ffffffffffffe5c8,iVar6);
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_ffffffffffffe540,
               pVVar9);
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x2a8857);
    local_19f0 = local_13a8;
    do {
      amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffe540);
      local_19f0 = local_19f0 + 0x30;
    } while (local_19f0 != local_f28);
    local_13ac = 0;
    while( true ) {
      do_tiling_ = (undefined1)((uint)in_stack_ffffffffffffe564 >> 0x18);
      iVar6 = (int)((ulong)pVVar9 >> 0x20);
      if (2 < local_13ac) break;
      pBVar10 = amrex::AmrLevel::getEdgeBoxArray((AmrLevel *)in_stack_ffffffffffffe540,iVar6);
      lVar11 = (long)local_13ac;
      local_13d8 = 0;
      uStack_13d0 = 0;
      local_13e8 = 0;
      uStack_13e0 = 0;
      local_13c8 = 0;
      local_13b8 = pBVar10;
      amrex::MFInfo::MFInfo((MFInfo *)0x2a896b);
      pVVar9 = (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffe540);
      (**(code **)(local_13a8[lVar11 * 0x30] + 0x10))
                (local_13a8 + lVar11 * 0x30,pBVar10,in_RDI + 0x140,9,1,&local_13e8);
      amrex::MFInfo::~MFInfo((MFInfo *)0x2a89d1);
      local_13ac = local_13ac + 1;
    }
    this_01 = (MLEBABecLap *)(in_RDI + 0x10);
    this_02 = (FabArray<amrex::FArrayBox> *)(local_f28 + 4);
    mfi_00 = (MFIter *)CONCAT44(iVar6,9);
    amrex::EB_interp_CellCentroid_to_FaceCentroid
              (in_stack_ffffffffffffeeb8,in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeea8,
               in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98,
               in_stack_fffffffffffffd10,in_stack_fffffffffffffd18,in_stack_fffffffffffffd20);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffe570,in_stack_ffffffffffffe568,(bool)do_tiling_);
    while (bVar5 = amrex::MFIter::isValid(&local_1448), bVar5) {
      piVar14 = local_146c;
      amrex::MFIter::tilebox((MFIter *)in_stack_ffffffffffffe5a0);
      local_1450 = piVar14;
      local_1478 = (EBFArrayBox *)
                   amrex::FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)this_01,mfi_00);
      local_1480 = amrex::EBFArrayBox::getEBCellFlagFab(local_1478);
      local_18 = local_1450;
      local_1c = 0;
      local_149c.smallend.vect._0_8_ = *(undefined8 *)local_1450;
      local_149c.smallend.vect[2] = local_1450[2];
      local_149c.bigend.vect[0] = local_1450[3];
      local_149c.bigend.vect._4_8_ = *(undefined8 *)(local_1450 + 4);
      local_149c.btype.itype = local_1450[6];
      amrex::Box::grow(&local_149c,0);
      FVar7 = amrex::EBCellFlagFab::getType(in_stack_ffffffffffffe668,bx_in);
      if (FVar7 == covered) {
        for (local_14a0 = 0; local_14a0 < 3; local_14a0 = local_14a0 + 1) {
          amrex::MFIter::nodaltilebox
                    ((MFIter *)in_stack_ffffffffffffe5b0,
                     (int)((ulong)in_stack_ffffffffffffe5a8 >> 0x20));
          local_14c4._28_8_ = local_14c4;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe550,(MFIter *)this_02,
                     (int)((ulong)this_01 >> 0x20));
          local_14d0 = local_1510;
          in_stack_ffffffffffffe5b0 = (Print *)local_14c4._28_8_;
          memcpy(local_1550,local_14d0,0x3c);
          amrex::
          ParallelFor<PeleLM::compute_enthalpy_fluxes(amrex::MultiFab*const*,amrex::MultiFab_const*const*,double)::__1>
                    (in_stack_ffffffffffffe590,(anon_class_64_1_f5781bf4 *)in_stack_ffffffffffffe588
                    );
        }
      }
      else {
        for (local_1554 = 0; local_1554 < 3; local_1554 = local_1554 + 1) {
          amrex::MFIter::nodaltilebox
                    ((MFIter *)in_stack_ffffffffffffe5b0,
                     (int)((ulong)in_stack_ffffffffffffe5a8 >> 0x20));
          local_1560 = local_157c;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe550,(MFIter *)this_02,
                     (int)((ulong)this_01 >> 0x20));
          local_1588 = local_15c8;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffe550,(MFIter *)this_02,
                     (int)((ulong)this_01 >> 0x20));
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this_02,(MFIter *)this_01);
          local_1618 = local_1658;
          in_stack_ffffffffffffe5a8 = local_1560;
          memcpy(local_1718,local_1610,0x3c);
          memcpy(auStack_16d8,local_1588,0x3c);
          memcpy(auStack_1698,local_1618,0x3c);
          amrex::
          ParallelFor<PeleLM::compute_enthalpy_fluxes(amrex::MultiFab*const*,amrex::MultiFab_const*const*,double)::__2>
                    (in_stack_ffffffffffffe590,in_stack_ffffffffffffe588);
        }
      }
      amrex::MFIter::operator++(&local_1448);
    }
    amrex::MFIter::~MFIter((MFIter *)this_01);
    if (3 < NavierStokesBase::verbose) {
      local_171c = amrex::ParallelDescriptor::IOProcessorNumber();
      local_1728 = amrex::ParallelDescriptor::second();
      local_1728 = local_1728 - local_48;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_1728,local_171c);
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffe570,(ostream *)in_stack_ffffffffffffe568);
      amrex::Print::operator<<((Print *)this_01,(char (*) [47])mfi_00);
      amrex::Print::operator<<((Print *)this_01,(int *)mfi_00);
      amrex::Print::operator<<((Print *)this_01,(char (*) [9])mfi_00);
      amrex::Print::operator<<((Print *)this_01,(double *)mfi_00);
      amrex::Print::operator<<((Print *)this_01,(char *)mfi_00);
      amrex::Print::~Print(in_stack_ffffffffffffe5b0);
    }
    plVar13 = local_13a8;
    plVar12 = local_f28;
    do {
      plVar12 = plVar12 + -0x30;
      amrex::MultiFab::~MultiFab((MultiFab *)0x2a8ff9);
    } while (plVar12 != plVar13);
    amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
              ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x2a901a);
    amrex::MultiFab::~MultiFab((MultiFab *)0x2a9027);
    amrex::MultiFab::~MultiFab((MultiFab *)0x2a9034);
    amrex::MultiFab::~MultiFab((MultiFab *)0x2a9041);
    amrex::MLMG::~MLMG((MLMG *)this_01);
    amrex::MLEBABecLap::~MLEBABecLap(this_01);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
PeleLM::compute_enthalpy_fluxes (MultiFab* const*       flux,
                                 const MultiFab* const* beta,
                                 Real                   time)
{
  BL_PROFILE("PLM::compute_enthalpy_fluxes()");
  /*
    Build heat fluxes based on species fluxes, Gamma_m, and fill-patched cell-centered states
    Set:
         flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)
         flux[NUM_SPECIES+2] = - lambda grad T
  */

  AMREX_ASSERT(beta && beta[0]->nComp() == NUM_SPECIES+1);

  const Real strt_time = ParallelDescriptor::second();

  //
  // First step, we create an operator to get (EB-aware) fluxes from, it will provide flux[NUM_SPECIES+2]
  //

  LPInfo info;
  info.setAgglomeration(1);
  info.setConsolidation(1);
  info.setMetricTerm(false);
  info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
  const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>((parent->getLevel(level)).Factory());
  MLEBABecLap op({geom}, {grids}, {dmap}, info, {ebf});
#else
  MLABecLaplacian op({geom}, {grids}, {dmap}, info);
#endif

  op.setMaxOrder(diffusion->maxOrder());
  MLMG mg(op);

  {
    const Vector<BCRec>& theBCs = AmrLevel::desc_lst[State_Type].getBCs();
    const BCRec& bc = theBCs[Temp];

    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
    std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
    Diffusion::setDomainBC(mlmg_lobc, mlmg_hibc, bc); // Same for all comps, by assumption
    op.setDomainBC(mlmg_lobc, mlmg_hibc);
  }

  MultiFab TTc;
  if (level > 0)
  {
    PeleLM& clev = getLevel(level-1);
    TTc.define(clev.grids,clev.dmap,1,0,MFInfo(),clev.Factory());
    FillPatch(clev,TTc,0,time,State_Type,Temp,1,0);
    op.setCoarseFineBC(&TTc, crse_ratio[0]);
  }
  int ngrow = 1;
  MultiFab TT(grids,dmap,1,ngrow,MFInfo(),Factory());
  FillPatch(*this,TT,ngrow,time,State_Type,Temp,1,0);
  op.setLevelBC(0, &TT);

  // Creating alpha and beta coefficients.
  Real      a               = 0;
  Real      b               = 1.;
  op.setScalars(a, b);


  // Here it is NUM_SPECIES because lambda is stored after the last species (first starts at 0)
  Diffusion::setBeta(op,beta,NUM_SPECIES);

  AMREX_D_TERM( flux[0]->setVal(0., NUM_SPECIES+2, 1);,
                flux[1]->setVal(0., NUM_SPECIES+2, 1);,
                flux[2]->setVal(0., NUM_SPECIES+2, 1););

  // Here it is NUM_SPECIES+2 because this is the heat flux (NUM_SPECIES+3 in enth_diff_terms in fortran)
  // No multiplication by dt here
  diffusion->computeExtensiveFluxes(mg, TT, flux, NUM_SPECIES+2, 1, area, b);

  //
  // Now we have flux[NUM_SPECIES+2]
  // Second step, let's compute flux[NUM_SPECIES+1] = sum_m (H_m Gamma_m)


   // First we want to gather h_i from T and then interpolate it to face centroids
   MultiFab Enth(grids,dmap,NUM_SPECIES,ngrow,MFInfo(),Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid(); ++mfi)
   {
       const Box& gbx = mfi.growntilebox();
       auto const& T  = TT.const_array(mfi);
       auto const& Hi = Enth.array(mfi,0);

       amrex::ParallelFor(gbx, [T, Hi]
       AMREX_GPU_DEVICE (int i, int j, int k) noexcept
       {
          getHGivenT( i, j, k, T, Hi );
       });
   }

  Vector<BCRec> math_bc(NUM_SPECIES);
  math_bc = fetchBCArray(State_Type,first_spec,NUM_SPECIES);

  MultiFab enth_edgstate[AMREX_SPACEDIM];

  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    const BoxArray& ba = getEdgeBoxArray(idim);
    enth_edgstate[idim].define(ba, dmap, NUM_SPECIES, 1, MFInfo(), Factory());
  }

#ifdef AMREX_USE_EB
   EB_interp_CellCentroid_to_FaceCentroid(Enth, AMREX_D_DECL(enth_edgstate[0],enth_edgstate[1],enth_edgstate[2]), 0, 0, NUM_SPECIES, geom, math_bc);

#else
   const Box& domain = geom.Domain();
   bool use_harmonic_avg = def_harm_avg_cen2edge ? true : false;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(Enth,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      for (int dir = 0; dir < AMREX_SPACEDIM; dir++)
      {
         const Box ebx = mfi.nodaltilebox(dir);
         const Box& edomain = amrex::surroundingNodes(domain,dir);
         const auto& enth_c  = Enth.array(mfi,0);
         const auto& enth_ed = enth_edgstate[dir].array(mfi,0);
         const auto bc_lo = fpi_phys_loc(math_bc[0].lo(dir));
         const auto bc_hi = fpi_phys_loc(math_bc[0].hi(dir));
         amrex::ParallelFor(ebx, [dir, bc_lo, bc_hi, use_harmonic_avg, enth_c, enth_ed, edomain]
         AMREX_GPU_DEVICE (int i, int j, int k) noexcept
         {
            int idx[3] = {i,j,k};
            bool on_lo = ( ( bc_lo == HT_Edge ) && ( idx[dir] <= edomain.smallEnd(dir) ) );
            bool on_hi = ( ( bc_hi == HT_Edge ) && ( idx[dir] >= edomain.bigEnd(dir) ) );
            cen2edg_cpp( i, j, k, dir, NUM_SPECIES, use_harmonic_avg, on_lo, on_hi, enth_c, enth_ed);
         });
      }
   }
#endif

    //
    // Now we construct the actual fluxes: sum[ (species flux).(species enthalpy) ]
    //

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(TT,TilingIfNotGPU()); mfi.isValid(); ++mfi) {
#ifdef AMREX_USE_EB
        const Box &bx = mfi.tilebox();
        // this is to check efficiently if this tile contains any eb stuff
        const EBFArrayBox& in_fab = static_cast<EBFArrayBox const&>(TT[mfi]);
        const EBCellFlagFab& flags = in_fab.getEBCellFlagFab();

        if(flags.getType(amrex::grow(bx, 0)) == FabType::covered)
        {
            // If tile is completely covered by EB geometry, set
            // value to some very large number so we know if
            // we accidentaly use these covered vals later in calculations
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
            {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 1.2345e30;
                });
            }
        } else {
#endif
            for (int dir = 0; dir < AMREX_SPACEDIM; ++dir) {
                const Box&  ebox_d          = mfi.nodaltilebox(dir);
                auto const& flux_species_d  = (*flux[dir]).array(mfi, 0);
                auto const& flux_enthaply_d = (*flux[dir]).array(mfi, NUM_SPECIES+1);
                auto const& enth_d          = enth_edgstate[dir].array(mfi);

                amrex::ParallelFor(ebox_d, [=]
                AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                {
                    flux_enthaply_d(i,j,k) = 0.0;
                    for (int n = 0; n < NUM_SPECIES; n++) {
                        flux_enthaply_d(i,j,k) += flux_species_d(i,j,k,n)*enth_d(i,j,k,n);
                    }
                });
            }
#ifdef AMREX_USE_EB
        }
#endif
    }

    if (verbose > 3)
    {
      const int IOProc   = ParallelDescriptor::IOProcessorNumber();
      Real      run_time = ParallelDescriptor::second() - strt_time;
      ParallelDescriptor::ReduceRealMax(run_time,IOProc);
      amrex::Print() << "      PeleLM::compute_enthalpy_fluxes(): lev: " << level
                     << ", time: " << run_time << '\n';
    }
}